

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::anon_unknown_12::ScanLineProcess::update_pointers
          (ScanLineProcess *this,DeepFrameBuffer *outfb,int fbY,int fbLastY)

{
  int iVar1;
  exr_coding_channel_info_t *peVar2;
  long lVar3;
  DeepSlice *pDVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  int c;
  long lVar8;
  
  iVar1 = (this->cinfo).start_y;
  (this->decoder).user_line_begin_skip = fbY - iVar1;
  (this->decoder).user_line_end_ignore = 0;
  lVar3 = (long)iVar1 + (long)(this->cinfo).height + -1;
  if (fbLastY < lVar3) {
    (this->decoder).user_line_end_ignore = (int)lVar3 - fbLastY;
  }
  if (this->counts_only == false) {
    lVar3 = 0x28;
    for (lVar8 = 0; lVar8 < (this->decoder).channel_count; lVar8 = lVar8 + 1) {
      peVar2 = (this->decoder).channels;
      pDVar4 = DeepFrameBuffer::findSlice(outfb,*(char **)((long)peVar2 + lVar3 + -0x28));
      sVar5 = 0;
      if (pDVar4 == (DeepSlice *)0x0) {
        sVar6 = 0;
        pcVar7 = (char *)0x0;
      }
      else {
        sVar6 = 0;
        pcVar7 = (char *)0x0;
        if (*(int *)((long)peVar2 + lVar3 + -0x20) != 0) {
          *(undefined2 *)((long)peVar2 + lVar3 + -0xc) =
               *(undefined2 *)&(pDVar4->super_Slice).field_0x34;
          *(short *)((long)peVar2 + lVar3 + -10) = (short)(pDVar4->super_Slice).type;
          sVar5 = (pDVar4->super_Slice).xStride;
          sVar6 = (pDVar4->super_Slice).yStride;
          pcVar7 = (pDVar4->super_Slice).base +
                   sVar6 * (long)fbY + (long)(this->cinfo).start_x * sVar5;
        }
      }
      *(int *)((long)peVar2 + lVar3 + -8) = (int)sVar5;
      *(int *)((long)peVar2 + lVar3 + -4) = (int)sVar6;
      *(char **)((long)&peVar2->channel_name + lVar3) = pcVar7;
      lVar3 = lVar3 + 0x30;
    }
  }
  return;
}

Assistant:

void ScanLineProcess::update_pointers (
    const DeepFrameBuffer *outfb, int fbY, int fbLastY)
{
    decoder.user_line_begin_skip = fbY - cinfo.start_y;
    decoder.user_line_end_ignore = 0;
    int64_t endY = (int64_t)cinfo.start_y + (int64_t)cinfo.height - 1;
    if ((int64_t)fbLastY < endY)
        decoder.user_line_end_ignore = (int32_t)(endY - fbLastY);

    if (counts_only)
        return;

    for (int c = 0; c < decoder.channel_count; ++c)
    {
        exr_coding_channel_info_t& curchan = decoder.channels[c];
        uint8_t*                   ptr;
        const DeepSlice*           fbslice;

        fbslice = outfb->findSlice (curchan.channel_name);

        if (curchan.height == 0 || !fbslice)
        {
            curchan.decode_to_ptr     = NULL;
            curchan.user_pixel_stride = 0;
            curchan.user_line_stride  = 0;
            continue;
        }

        curchan.user_bytes_per_element = fbslice->sampleStride;
        curchan.user_data_type         = (exr_pixel_type_t)fbslice->type;
        curchan.user_pixel_stride      = fbslice->xStride;
        curchan.user_line_stride       = fbslice->yStride;

        ptr  = reinterpret_cast<uint8_t*> (fbslice->base);
        ptr += int64_t (cinfo.start_x) * int64_t (fbslice->xStride);
        ptr += int64_t (fbY) * int64_t (fbslice->yStride);

        curchan.decode_to_ptr = ptr;
    }
}